

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

Bdd __thiscall sylvan::Bdd::Restrict(Bdd *this,Bdd *c)

{
  char *in_RDX;
  Task local_50;
  
  local_50.d._0_8_ = c->bdd;
  local_50.d._8_8_ = *(undefined8 *)in_RDX;
  local_50.f = sylvan_restrict_WRAP;
  local_50.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
  local_50.d[0x10] = '\0';
  local_50.d[0x11] = '\0';
  local_50.d[0x12] = '\0';
  local_50.d[0x13] = '\0';
  lace_run_task(&local_50);
  this->bdd = local_50.d._0_8_;
  mtbdd_protect(&this->bdd);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::Restrict(const Bdd &c) const
{
    return sylvan_restrict(bdd, c.bdd);
}